

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O1

void __thiscall
SemanticAnalyserTest_VariableAccessInArgumentWorks_Test::
~SemanticAnalyserTest_VariableAccessInArgumentWorks_Test
          (SemanticAnalyserTest_VariableAccessInArgumentWorks_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, VariableAccessInArgumentWorks)
{
  std::string source = R"SRC(
  fn test(x: f32, y: f32): void
  {
    print("x = " : x : " y = " : y);
  }
  
  fn main(): f32
  {
    let x: f32 = 12;
    let y: f32 = 14;
    test(x, y);
    ret 0;
  }
  )SRC";
  nothrowTest(source);
}